

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

_Bool roaring_uint32_iterator_previous(roaring_uint32_iterator_t *it)

{
  uint uVar1;
  _Bool _Var2;
  roaring_uint32_iterator_t *in_RDI;
  uint16_t low16;
  uint16_t *in_stack_00000020;
  roaring_container_iterator_t *in_stack_00000028;
  uint8_t in_stack_00000037;
  container_t *in_stack_00000038;
  _Bool local_1;
  
  if (in_RDI->container_index < 0) {
    in_RDI->has_value = false;
    local_1 = false;
  }
  else if (in_RDI->container_index < (in_RDI->parent->high_low_container).size) {
    uVar1 = in_RDI->current_value;
    _Var2 = container_iterator_prev
                      (in_stack_00000038,in_stack_00000037,in_stack_00000028,in_stack_00000020);
    if (_Var2) {
      in_RDI->current_value = in_RDI->highbits | uVar1 & 0xffff;
      in_RDI->has_value = true;
      local_1 = true;
    }
    else {
      in_RDI->container_index = in_RDI->container_index + -1;
      local_1 = loadlastvalue(in_RDI);
      in_RDI->has_value = local_1;
    }
  }
  else {
    in_RDI->container_index = (in_RDI->parent->high_low_container).size + -1;
    local_1 = loadlastvalue(in_RDI);
    in_RDI->has_value = local_1;
  }
  return local_1;
}

Assistant:

bool roaring_uint32_iterator_previous(roaring_uint32_iterator_t *it) {
    if (it->container_index < 0) {
        return (it->has_value = false);
    }
    if (it->container_index >= it->parent->high_low_container.size) {
        it->container_index = it->parent->high_low_container.size - 1;
        return (it->has_value = loadlastvalue(it));
    }
    uint16_t low16 = (uint16_t)it->current_value;
    if (container_iterator_prev(it->container, it->typecode, &it->container_it,
                                &low16)) {
        it->current_value = it->highbits | low16;
        return (it->has_value = true);
    }
    it->container_index--;
    return (it->has_value = loadlastvalue(it));
}